

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

QcList * qc_list_create(int with_rwlock)

{
  QcRWLock *pQVar1;
  QcList *list;
  QcList *pQStack_10;
  int with_rwlock_local;
  
  pQStack_10 = (QcList *)malloc(0x28);
  if (pQStack_10 != (QcList *)0x0) {
    memset(pQStack_10,0,0x28);
    if (pQStack_10 == (QcList *)0x0) {
      pQStack_10 = (QcList *)0x0;
    }
    else {
      pQStack_10->head = (QcListEntry *)0x0;
      pQStack_10->tail = (QcListEntry *)0x0;
      pQStack_10->cur = (QcListEntry *)0x0;
      pQStack_10->count = 0;
      pQStack_10->rwlock = (QcRWLock *)0x0;
      if (with_rwlock != 0) {
        pQVar1 = qc_thread_rwlock_create();
        pQStack_10->rwlock = pQVar1;
        if (pQStack_10->rwlock == (QcRWLock *)0x0) {
          free(pQStack_10);
          pQStack_10 = (QcList *)0x0;
        }
      }
    }
    return pQStack_10;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x1a3);
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x1a3,"QcList *qc_list_create(int)");
}

Assistant:

QcList *qc_list_create(int with_rwlock)
{       
    QcList *list;

    qc_malloc(list, sizeof(struct __QcList));
    if(NULL == list)
    {
        return NULL;
    }

    list->head = NULL;
    list->tail = NULL;
    list->cur  = NULL;
    list->count = 0;
    list->rwlock = NULL;

    if(with_rwlock)
    {
        list->rwlock = qc_thread_rwlock_create();
        if(NULL == list->rwlock)
        {
            qc_free(list);
            return NULL;
        }
    }

    return list;
}